

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::checkmesh(tetgenmesh *this,int topoflag)

{
  uint uVar1;
  int iVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  double *pa;
  double *pb;
  double *pc;
  double *pd;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  double dVar12;
  uint local_7c;
  ulong local_50;
  int (*local_40) [12];
  
  if (this->b->quiet == 0) {
    puts("  Checking consistency of mesh...");
  }
  pmVar3 = this->tetrahedrons;
  ppvVar4 = pmVar3->firstblock;
  pmVar3->pathblock = ppvVar4;
  pmVar3->pathitem =
       (void *)((long)ppvVar4 +
               (((long)pmVar3->alignbytes + 8U) -
               (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
  pmVar3->pathitemsleft = pmVar3->itemsperblock;
  do {
    pvVar6 = memorypool::traverse(this->tetrahedrons);
    if (pvVar6 == (void *)0x0) {
      pvVar6 = (void *)0x0;
      break;
    }
  } while (*(long *)((long)pvVar6 + 0x20) == 0);
  if (pvVar6 == (void *)0x0) {
    local_7c = 0;
  }
  else {
    local_7c = 0;
    do {
      local_40 = fsymtbl;
      lVar9 = 0;
      local_50 = 0;
      do {
        pa = *(double **)((long)pvVar6 + (long)*(int *)((long)orgpivot + lVar9) * 8);
        pb = *(double **)((long)pvVar6 + (long)*(int *)((long)destpivot + lVar9) * 8);
        pc = *(double **)((long)pvVar6 + (long)*(int *)((long)apexpivot + lVar9) * 8);
        pd = *(double **)((long)pvVar6 + (long)*(int *)((long)oppopivot + lVar9) * 8);
        if (lVar9 == 0) {
          if (((topoflag == 0) && (*(point *)((long)pvVar6 + 0x38) != this->dummypoint)) &&
             (dVar12 = orient3d(pa,pb,pc,pd), 0.0 <= dVar12)) {
            pcVar8 = "Degenerated";
            if (0.0 < dVar12) {
              pcVar8 = "Inverted";
            }
            printf("  !! !! %s ",pcVar8);
            lVar7 = (long)this->pointmarkindex;
            printf("  (%d, %d, %d, %d) (ori = %.17g)\n",dVar12,
                   (ulong)*(uint *)((long)pa + lVar7 * 4),(ulong)*(uint *)((long)pb + lVar7 * 4),
                   (ulong)*(uint *)((long)pc + lVar7 * 4),(ulong)*(uint *)((long)pd + lVar7 * 4));
            local_7c = local_7c + 1;
          }
          if ((*(byte *)((long)pvVar6 + (long)this->elemmarkerindex * 4) & 1) != 0) {
            lVar7 = (long)this->pointmarkindex;
            printf("  !! (%d, %d, %d, %d) is infected.\n",(ulong)*(uint *)((long)pa + lVar7 * 4),
                   (ulong)*(uint *)((long)pb + lVar7 * 4),(ulong)*(uint *)((long)pc + lVar7 * 4),
                   (ulong)*(uint *)((long)pd + lVar7 * 4));
            local_7c = local_7c + 1;
          }
          if ((*(byte *)((long)pvVar6 + (long)this->elemmarkerindex * 4) & 2) != 0) {
            lVar7 = (long)this->pointmarkindex;
            printf("  !! (%d, %d, %d, %d) is marked.\n",(ulong)*(uint *)((long)pa + lVar7 * 4),
                   (ulong)*(uint *)((long)pb + lVar7 * 4),(ulong)*(uint *)((long)pc + lVar7 * 4),
                   (ulong)*(uint *)((long)pd + lVar7 * 4));
            local_7c = local_7c + 1;
          }
        }
        if (*(long *)((long)pvVar6 + lVar9 * 2) == 0) {
          lVar7 = (long)this->pointmarkindex;
          printf("  !! !! No neighbor at face (%d, %d, %d).\n",
                 (ulong)*(uint *)((long)pa + lVar7 * 4),(ulong)*(uint *)((long)pb + lVar7 * 4),
                 (ulong)*(uint *)((long)pc + lVar7 * 4));
LAB_0015041b:
          local_7c = local_7c + 1;
        }
        else {
          uVar5 = *(ulong *)((long)pvVar6 + lVar9 * 2);
          uVar11 = uVar5 & 0xfffffffffffffff0;
          if (uVar11 == 0) {
            lVar7 = (long)this->pointmarkindex;
            printf("  !! !! Tet-face has no neighbor (%d, %d, %d) - %d:\n",
                   (ulong)*(uint *)((long)pa + lVar7 * 4),(ulong)*(uint *)((long)pb + lVar7 * 4),
                   (ulong)*(uint *)((long)pc + lVar7 * 4),(ulong)*(uint *)((long)pd + lVar7 * 4));
            local_7c = local_7c + 1;
          }
          else {
            uVar1 = (*local_40)[(uint)uVar5 & 0xf];
            uVar5 = *(ulong *)(uVar11 + (ulong)(uVar1 & 3) * 8);
            pvVar10 = (void *)(uVar5 & 0xfffffffffffffff0);
            if ((pvVar6 != pvVar10) || (local_50 != (uint)fsymtbl[(int)uVar1][(uint)uVar5 & 0xf])) {
              puts("  !! !! Asymmetric tetra-tetra bond:");
              if (pvVar6 == pvVar10) {
                puts("   (Right tetrahedron, wrong orientation)");
              }
              lVar7 = (long)this->pointmarkindex;
              printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar7 * 4),
                     (ulong)*(uint *)((long)pb + lVar7 * 4),(ulong)*(uint *)((long)pc + lVar7 * 4),
                     (ulong)*(uint *)((long)pd + lVar7 * 4));
              lVar7 = (long)this->pointmarkindex;
              printf("    Second: (%d, %d, %d, %d)\n",
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)orgpivot[(int)uVar1] * 8) + lVar7 * 4
                                     ),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)destpivot[(int)uVar1] * 8) +
                                     lVar7 * 4),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)apexpivot[(int)uVar1] * 8) +
                                     lVar7 * 4),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)oppopivot[(int)uVar1] * 8) +
                                     lVar7 * 4));
              local_7c = local_7c + 1;
            }
            if ((*(double **)(uVar11 + (long)orgpivot[(int)uVar1] * 8) != pb) ||
               (*(double **)(uVar11 + (long)destpivot[(int)uVar1] * 8) != pa)) {
              puts("  !! !! Wrong edge-edge bond:");
              lVar7 = (long)this->pointmarkindex;
              printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar7 * 4),
                     (ulong)*(uint *)((long)pb + lVar7 * 4),(ulong)*(uint *)((long)pc + lVar7 * 4),
                     (ulong)*(uint *)((long)pd + lVar7 * 4));
              lVar7 = (long)this->pointmarkindex;
              printf("    Second: (%d, %d, %d, %d)\n",
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)orgpivot[(int)uVar1] * 8) + lVar7 * 4
                                     ),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)destpivot[(int)uVar1] * 8) +
                                     lVar7 * 4),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)apexpivot[(int)uVar1] * 8) +
                                     lVar7 * 4),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)oppopivot[(int)uVar1] * 8) +
                                     lVar7 * 4));
              local_7c = local_7c + 1;
            }
            if (*(double **)(uVar11 + (long)apexpivot[(int)uVar1] * 8) != pc) {
              puts("  !! !! Wrong face-face bond:");
              lVar7 = (long)this->pointmarkindex;
              printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar7 * 4),
                     (ulong)*(uint *)((long)pb + lVar7 * 4),(ulong)*(uint *)((long)pc + lVar7 * 4),
                     (ulong)*(uint *)((long)pd + lVar7 * 4));
              lVar7 = (long)this->pointmarkindex;
              printf("    Second: (%d, %d, %d, %d)\n",
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)orgpivot[(int)uVar1] * 8) + lVar7 * 4
                                     ),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)destpivot[(int)uVar1] * 8) +
                                     lVar7 * 4),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)apexpivot[(int)uVar1] * 8) +
                                     lVar7 * 4),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)oppopivot[(int)uVar1] * 8) +
                                     lVar7 * 4));
              local_7c = local_7c + 1;
            }
            if (*(double **)(uVar11 + (long)oppopivot[(int)uVar1] * 8) == pd) {
              puts("  !! !! Two identical tetra:");
              lVar7 = (long)this->pointmarkindex;
              printf("    First:  (%d, %d, %d, %d)\n",(ulong)*(uint *)((long)pa + lVar7 * 4),
                     (ulong)*(uint *)((long)pb + lVar7 * 4),(ulong)*(uint *)((long)pc + lVar7 * 4),
                     (ulong)*(uint *)((long)pd + lVar7 * 4));
              lVar7 = (long)this->pointmarkindex;
              printf("    Second: (%d, %d, %d, %d)\n",
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)orgpivot[(int)uVar1] * 8) + lVar7 * 4
                                     ),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)destpivot[(int)uVar1] * 8) +
                                     lVar7 * 4),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)apexpivot[(int)uVar1] * 8) +
                                     lVar7 * 4),
                     (ulong)*(uint *)(*(long *)(uVar11 + (long)oppopivot[(int)uVar1] * 8) +
                                     lVar7 * 4));
              goto LAB_0015041b;
            }
          }
        }
        if ((*(uint *)((long)pvVar6 + (long)this->elemmarkerindex * 4) >> ((byte)local_50 & 0x1f) &
            4) != 0) {
          lVar7 = (long)this->pointmarkindex;
          printf("  !! tetface (%d, %d, %d) %d is marked.\n",(ulong)*(uint *)((long)pa + lVar7 * 4),
                 (ulong)*(uint *)((long)pb + lVar7 * 4),(ulong)*(uint *)((long)pc + lVar7 * 4),
                 (ulong)*(uint *)((long)pd + lVar7 * 4));
        }
        local_50 = local_50 + 1;
        lVar9 = lVar9 + 4;
        local_40 = local_40 + 1;
      } while (lVar9 != 0x10);
      lVar9 = 0;
      do {
        iVar2 = *(int *)((long)edge2ver + lVar9);
        if ((*(uint *)((long)pvVar6 + (long)this->elemmarkerindex * 4) >>
             (*(byte *)(ver2edge + iVar2) & 0x1f) & 0x40) != 0) {
          lVar7 = (long)this->pointmarkindex;
          printf("  !! tetedge (%d, %d) %d, %d is marked.\n",
                 (ulong)*(uint *)(*(long *)((long)pvVar6 + (long)orgpivot[iVar2] * 8) + lVar7 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar6 + (long)destpivot[iVar2] * 8) + lVar7 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar6 + (long)apexpivot[iVar2] * 8) + lVar7 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar6 + (long)oppopivot[iVar2] * 8) + lVar7 * 4))
          ;
        }
        lVar9 = lVar9 + 4;
      } while (lVar9 != 0x18);
      do {
        pvVar6 = memorypool::traverse(this->tetrahedrons);
        if (pvVar6 == (void *)0x0) {
          pvVar6 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar6 + 0x20) == 0);
    } while (pvVar6 != (void *)0x0);
  }
  if (local_7c == 0) {
    if (this->b->quiet == 0) {
      puts("  In my studied opinion, the mesh appears to be consistent.");
    }
  }
  else {
    pcVar8 = "abnormities";
    if (1 < (int)local_7c) {
      pcVar8 = "abnormity";
    }
    printf("  !! !! !! !! %d %s witnessed.\n",(ulong)local_7c,pcVar8);
  }
  return local_7c;
}

Assistant:

int tetgenmesh::checkmesh(int topoflag)
{
  triface tetloop, neightet, symtet;
  point pa, pb, pc, pd;
  REAL ori;
  int horrors, i;

  if (!b->quiet) {
    printf("  Checking consistency of mesh...\n");
  }

  horrors = 0;
  tetloop.ver = 0;
  // Run through the list of tetrahedra, checking each one.
  tetrahedrons->traversalinit();
  tetloop.tet = alltetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Check all four faces of the tetrahedron.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      pa = org(tetloop);
      pb = dest(tetloop);
      pc = apex(tetloop);
      pd = oppo(tetloop);
      if (tetloop.ver == 0) {  // Only test for inversion once.
        if (!ishulltet(tetloop)) {  // Only do test if it is not a hull tet.
          if (!topoflag) {
            ori = orient3d(pa, pb, pc, pd);
            if (ori >= 0.0) {
              printf("  !! !! %s ", ori > 0.0 ? "Inverted" : "Degenerated");
              printf("  (%d, %d, %d, %d) (ori = %.17g)\n", pointmark(pa),
                     pointmark(pb), pointmark(pc), pointmark(pd), ori);
              horrors++;
            }
          }
        }
        if (infected(tetloop)) { 
          // This may be a bug. Report it.
          printf("  !! (%d, %d, %d, %d) is infected.\n", pointmark(pa),
                 pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
        if (marktested(tetloop)) {
          // This may be a bug. Report it.
          printf("  !! (%d, %d, %d, %d) is marked.\n", pointmark(pa),
                 pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
      }
      if (tetloop.tet[tetloop.ver] == NULL) {
        printf("  !! !! No neighbor at face (%d, %d, %d).\n", pointmark(pa),
               pointmark(pb), pointmark(pc));
        horrors++;
      } else {
        // Find the neighboring tetrahedron on this face.
        fsym(tetloop, neightet);
        if (neightet.tet != NULL) {
          // Check that the tetrahedron's neighbor knows it's a neighbor.
          fsym(neightet, symtet);
          if ((tetloop.tet != symtet.tet) || (tetloop.ver != symtet.ver)) {
            printf("  !! !! Asymmetric tetra-tetra bond:\n");
            if (tetloop.tet == symtet.tet) {
              printf("   (Right tetrahedron, wrong orientation)\n");
            }
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same edge (the bond() operation).
          if ((org(neightet) != pb) || (dest(neightet) != pa)) {
            printf("  !! !! Wrong edge-edge bond:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same apex.
          if (apex(neightet) != pc) {
            printf("  !! !! Wrong face-face bond:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
          // Check if they have the same opposite.
          if (oppo(neightet) == pd) {
            printf("  !! !! Two identical tetra:\n");
            printf("    First:  (%d, %d, %d, %d)\n", pointmark(pa),
                   pointmark(pb), pointmark(pc), pointmark(pd));
            printf("    Second: (%d, %d, %d, %d)\n", pointmark(org(neightet)),
                   pointmark(dest(neightet)), pointmark(apex(neightet)),
                   pointmark(oppo(neightet)));
            horrors++;
          }
        } else {
          printf("  !! !! Tet-face has no neighbor (%d, %d, %d) - %d:\n",
                 pointmark(pa), pointmark(pb), pointmark(pc), pointmark(pd));
          horrors++;
        }
      }
      if (facemarked(tetloop)) {
        // This may be a bug. Report it.
        printf("  !! tetface (%d, %d, %d) %d is marked.\n", pointmark(pa),
               pointmark(pb), pointmark(pc), pointmark(pd));
      }
    }
    // Check the six edges of this tet.
    for (i = 0; i < 6; i++) {
      tetloop.ver = edge2ver[i];
      if (edgemarked(tetloop)) {
        // This may be a bug. Report it.
        printf("  !! tetedge (%d, %d) %d, %d is marked.\n", 
               pointmark(org(tetloop)), pointmark(dest(tetloop)), 
               pointmark(apex(tetloop)), pointmark(oppo(tetloop)));
      }
    }
    tetloop.tet = alltetrahedrontraverse();
  }
  if (horrors == 0) {
    if (!b->quiet) {
      printf("  In my studied opinion, the mesh appears to be consistent.\n");
    }
  } else {
    printf("  !! !! !! !! %d %s witnessed.\n", horrors, 
           horrors > 1 ? "abnormity" : "abnormities");
  }

  return horrors;
}